

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O0

FilteredBreakIteratorBuilder *
icu_63::FilteredBreakIteratorBuilder::createEmptyInstance(UErrorCode *status)

{
  UBool UVar1;
  SimpleFilteredBreakIteratorBuilder *this;
  size_t in_RSI;
  FilteredBreakIteratorBuilder *local_68;
  SimpleFilteredBreakIteratorBuilder *local_48;
  LocalPointerBase<icu_63::FilteredBreakIteratorBuilder> local_20;
  LocalPointer<icu_63::FilteredBreakIteratorBuilder> ret;
  UErrorCode *status_local;
  
  ret.super_LocalPointerBase<icu_63::FilteredBreakIteratorBuilder>.ptr =
       (LocalPointerBase<icu_63::FilteredBreakIteratorBuilder>)
       (LocalPointerBase<icu_63::FilteredBreakIteratorBuilder>)status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    this = (SimpleFilteredBreakIteratorBuilder *)UMemory::operator_new((UMemory *)0x30,in_RSI);
    local_48 = (SimpleFilteredBreakIteratorBuilder *)0x0;
    if (this != (SimpleFilteredBreakIteratorBuilder *)0x0) {
      SimpleFilteredBreakIteratorBuilder::SimpleFilteredBreakIteratorBuilder
                (this,(UErrorCode *)
                      ret.super_LocalPointerBase<icu_63::FilteredBreakIteratorBuilder>.ptr);
      local_48 = this;
    }
    LocalPointer<icu_63::FilteredBreakIteratorBuilder>::LocalPointer
              ((LocalPointer<icu_63::FilteredBreakIteratorBuilder> *)&local_20,
               &local_48->super_FilteredBreakIteratorBuilder,
               (UErrorCode *)ret.super_LocalPointerBase<icu_63::FilteredBreakIteratorBuilder>.ptr);
    UVar1 = ::U_SUCCESS(*(UErrorCode *)
                         ret.super_LocalPointerBase<icu_63::FilteredBreakIteratorBuilder>.ptr);
    if (UVar1 == '\0') {
      local_68 = (FilteredBreakIteratorBuilder *)0x0;
    }
    else {
      local_68 = LocalPointerBase<icu_63::FilteredBreakIteratorBuilder>::orphan(&local_20);
    }
    status_local = (UErrorCode *)local_68;
    LocalPointer<icu_63::FilteredBreakIteratorBuilder>::~LocalPointer
              ((LocalPointer<icu_63::FilteredBreakIteratorBuilder> *)&local_20);
  }
  else {
    status_local = (UErrorCode *)0x0;
  }
  return (FilteredBreakIteratorBuilder *)status_local;
}

Assistant:

FilteredBreakIteratorBuilder *
FilteredBreakIteratorBuilder::createEmptyInstance(UErrorCode& status) {
  if(U_FAILURE(status)) return NULL;
  LocalPointer<FilteredBreakIteratorBuilder> ret(new SimpleFilteredBreakIteratorBuilder(status), status);
  return (U_SUCCESS(status))? ret.orphan(): NULL;
}